

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

region region_calculate(region loc)

{
  region rVar1;
  int local_30;
  int local_2c;
  wchar_t h;
  wchar_t w;
  region loc_local;
  
  loc_local._0_8_ = loc._8_8_;
  _h = loc._0_8_;
  Term_get_size(&local_2c,&local_30);
  if (h < L'\0') {
    _h = CONCAT44(w,local_2c + h);
  }
  if (_h < 0) {
    _h = CONCAT44(local_30 + w,h);
  }
  if (loc_local.col < 1) {
    loc_local.col = (local_2c - h) + loc_local.col;
  }
  if (loc_local.row < 1) {
    loc_local.row = (local_30 - w) + loc_local.row;
  }
  rVar1.width = loc_local.col;
  rVar1.page_rows = loc_local.row;
  rVar1.col = h;
  rVar1.row = w;
  return rVar1;
}

Assistant:

region region_calculate(region loc)
{
	int w, h;
	Term_get_size(&w, &h);

	if (loc.col < 0)
		loc.col += w;
	if (loc.row < 0)
		loc.row += h;
	if (loc.width <= 0)
		loc.width += w - loc.col;
	if (loc.page_rows <= 0)
		loc.page_rows += h - loc.row;

	return loc;
}